

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

int __thiscall capnp::_::OrphanBuilder::truncate(OrphanBuilder *this,char *__file,__off_t __length)

{
  CapTableBuilder *capTable;
  uint uVar1;
  uint extraout_EAX;
  BuilderArena *arena;
  OrphanBuilder local_40;
  uint local_1c;
  OrphanBuilder *pOStack_18;
  ElementCount size_local;
  OrphanBuilder *this_local;
  StructSize elementSize_local;
  
  this_local._4_4_ = SUB84(__length,0);
  local_1c = (uint)__file;
  pOStack_18 = this;
  uVar1 = truncate(this,(char *)((ulong)__file & 0xffffffff),0);
  if ((uVar1 & 1) == 0) {
    arena = SegmentBuilder::getArena(this->segment);
    capTable = this->capTable;
    uVar1 = assumeBits<29u,unsigned_int>(local_1c);
    initStructList(&local_40,arena,capTable,uVar1,this_local._4_4_);
    operator=(this,&local_40);
    ~OrphanBuilder(&local_40);
    uVar1 = extraout_EAX;
  }
  return uVar1;
}

Assistant:

void OrphanBuilder::truncate(ElementCount size, StructSize elementSize) {
  if (!truncate(size, false)) {
    // assumeBits() safe since it's checked inside truncate()
    *this = initStructList(segment->getArena(), capTable,
        assumeBits<LIST_ELEMENT_COUNT_BITS>(size), elementSize);
  }
}